

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void kratos::dead_code_elimination(Generator *top)

{
  size_t *psVar1;
  undefined1 local_68 [8];
  DeadCodeVarElimination visitor;
  
  psVar1 = &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_68 = (undefined1  [8])&PTR_visit_root_002b25b8;
  visitor.super_IRVisitor._8_8_ = psVar1;
  IRVisitor::visit_generator_root_p((IRVisitor *)local_68,top);
  IRVisitor::~IRVisitor((IRVisitor *)local_68);
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_68 = (undefined1  [8])&PTR_visit_root_002b2718;
  visitor.super_IRVisitor._8_8_ = psVar1;
  IRVisitor::visit_generator_root_p((IRVisitor *)local_68,top);
  IRVisitor::~IRVisitor((IRVisitor *)local_68);
  remove_empty_block(top);
  return;
}

Assistant:

void dead_code_elimination(Generator* top) {
    {
        DeadCodeVarElimination visitor;
        visitor.visit_generator_root_p(top);
    }
    {
        DeadCodeInstanceElimination visitor;
        visitor.visit_generator_root_p(top);
    }

    // clean up empty stmt blocks
    remove_empty_block(top);
}